

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
despot::Parser::GetNextState
          (Parser *this,vector<int,_std::allocator<int>_> *state,ACT_TYPE action,double *random)

{
  CPT *pCVar1;
  const_reference cVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  int s;
  long lVar6;
  int *piVar7;
  ulong uVar8;
  long lVar9;
  
  piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar4 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar7 = &(((this->prev_state_vars_).
              super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
              super__Vector_impl_data._M_start)->super_NamedVar).super_Variable.curr_value;
  for (uVar8 = 0; uVar8 < (ulong)((long)piVar4 - (long)piVar5 >> 2); uVar8 = uVar8 + 1) {
    *piVar7 = piVar5[uVar8];
    piVar7 = piVar7 + 0x30;
  }
  (((this->action_vars_).super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
    _M_impl.super__Vector_impl_data._M_start)->super_Variable).curr_value = action;
  lVar9 = 10;
  lVar6 = 0;
  for (uVar8 = 0; uVar8 < (ulong)((long)piVar4 - (long)piVar5 >> 2); uVar8 = uVar8 + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       ((long)&(((this->is_identity_).
                                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Bvector_base<std::allocator<bool>_>)._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar6),(long)action);
    if (cVar2) {
      piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3 = piVar5[uVar8];
    }
    else {
      pCVar1 = (this->transition_funcs_).
               super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      iVar3 = (*(pCVar1->super_Function)._vptr_Function[0xe])(pCVar1,random);
      piVar5 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar5[uVar8] = iVar3;
    }
    *(int *)(&(((this->curr_state_vars_).
                super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                super__Vector_impl_data._M_start)->super_NamedVar).super_Variable._vptr_Variable +
            lVar9) = iVar3;
    piVar4 = (state->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    lVar6 = lVar6 + 0x28;
    lVar9 = lVar9 + 0x18;
  }
  return;
}

Assistant:

void Parser::GetNextState(vector<int>& state, ACT_TYPE action,
	double& random) const {
	for (int s = 0; s < state.size(); s++) {
		prev_state_vars_[s].curr_value = state[s];
	}
	action_vars_[0].curr_value = action;

	for (int s = 0; s < state.size(); s++) {
		if (!is_identity_[s][action])
			state[s] = transition_funcs_[s]->ComputeCurrentIndex(random);
		curr_state_vars_[s].curr_value = state[s];
	}
}